

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

bool idx2::operator==(stref *Lhs,stref *Rhs)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = Lhs->Size;
  uVar3 = (ulong)uVar1;
  if (uVar1 == Rhs->Size) {
    if ((int)uVar1 < 1) {
      bVar2 = true;
    }
    else {
      uVar4 = 0;
      do {
        if (uVar3 == uVar4) {
          __assert_fail("Idx < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                        ,0x9b,"char &idx2::stref::operator[](int) const");
        }
        if ((Lhs->field_0).Ptr[uVar4] != (Rhs->field_0).Ptr[uVar4]) goto LAB_00187782;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
      bVar2 = uVar3 <= uVar4;
    }
  }
  else {
LAB_00187782:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
operator==(const stref& Lhs, const stref& Rhs)
{
  stref& LhsR = const_cast<stref&>(Lhs);
  stref& RhsR = const_cast<stref&>(Rhs);
  if (LhsR.Size != RhsR.Size)
    return false;
  for (int I = 0; I < LhsR.Size; ++I)
  {
    if (LhsR[I] != RhsR[I])
      return false;
  }
  return true;
}